

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

bool __thiscall CCoinsViewCache::Sync(CCoinsViewCache *this)

{
  byte bVar1;
  CoinsCachePair *pCVar2;
  logic_error *this_00;
  size_t *in_RDI;
  long in_FS_OFFSET;
  bool fOk;
  CoinsViewCacheCursor cursor;
  bool in_stack_ffffffffffffff9f;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  CoinsCachePair *in_stack_ffffffffffffffa8;
  CoinsViewCacheCursor *in_stack_ffffffffffffffb8;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CoinsViewCacheCursor::CoinsViewCacheCursor
            (in_stack_ffffffffffffffb8,in_RDI,in_stack_ffffffffffffffa8,
             (CCoinsMap *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff9f);
  bVar1 = (**(code **)(*(long *)in_RDI[1] + 0x20))((long *)in_RDI[1],local_28,(long)in_RDI + 0x11);
  if (((bool)(bVar1 & 1) == false) ||
     (pCVar2 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffffa8),
     pCVar2 == (CoinsCachePair *)(in_RDI + 0x20))) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return (bool)(bVar1 & 1);
    }
  }
  else {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Not all unspent flagged entries were cleared");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewCache::Sync()
{
    auto cursor{CoinsViewCacheCursor(cachedCoinsUsage, m_sentinel, cacheCoins, /*will_erase=*/false)};
    bool fOk = base->BatchWrite(cursor, hashBlock);
    if (fOk) {
        if (m_sentinel.second.Next() != &m_sentinel) {
            /* BatchWrite must clear flags of all entries */
            throw std::logic_error("Not all unspent flagged entries were cleared");
        }
    }
    return fOk;
}